

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

int32_t uscript_getSampleString_63
                  (UScriptCode script,UChar *dest,int32_t capacity,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  uint uVar2;
  uint uVar3;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((-1 < capacity) && (dest != (UChar *)0x0 || capacity == 0)) {
      iVar1 = 0;
      uVar3 = 0;
      if ((uint)script < 0xb9) {
        uVar3 = *(uint *)((anonymous_namespace)::SCRIPT_PROPS + (ulong)(uint)script * 4);
      }
      uVar2 = uVar3 & 0x1fffff;
      if ((uVar2 != 0) && (iVar1 = 2 - (uint)(uVar2 < 0x10000), iVar1 <= capacity)) {
        if (uVar2 < 0x10000) {
          *dest = (UChar)uVar3;
        }
        else {
          *dest = (short)(uVar2 >> 10) + L'ퟀ';
          dest[1] = (UChar)uVar3 & 0x3ffU | 0xdc00;
        }
      }
      iVar1 = u_terminateUChars_63(dest,capacity,iVar1,pErrorCode);
      return iVar1;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }